

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlabel.cpp
# Opt level: O2

void QLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  byte bVar5;
  QPixmap QVar6;
  undefined4 uVar7;
  QPixmap *pQVar8;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  qsizetype local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        linkActivated((QLabel *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        linkHovered((QLabel *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 2:
      pQVar8 = (QPixmap *)_a[1];
switchD_003e5fa8_caseD_0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setText((QLabel *)_o,(QString *)pQVar8);
        return;
      }
      break;
    case 3:
      pQVar8 = (QPixmap *)_a[1];
switchD_003e5fa8_caseD_2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setPixmap((QLabel *)_o,pQVar8);
        return;
      }
      break;
    case 4:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setPicture((QLabel *)_o,(QPicture *)_a[1]);
        return;
      }
      break;
    case 5:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMovie((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setNum((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 7:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setNum((QLabel *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        clear((QLabel *)_o);
        return;
      }
      break;
    default:
      goto switchD_003e5f46_caseD_3;
    }
    goto LAB_003e6391;
  case ReadProperty:
    if (0xb < (uint)_id) goto switchD_003e5f46_caseD_3;
    break;
  case WriteProperty:
    if ((uint)_id < 10) {
      pQVar8 = (QPixmap *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003e5fa8_caseD_0;
      case 1:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setTextFormat((QLabel *)_o,*(Int *)pQVar8);
          return;
        }
        break;
      case 2:
        goto switchD_003e5fa8_caseD_2;
      case 3:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setScaledContents((QLabel *)_o,(bool)*pQVar8);
          return;
        }
        break;
      case 4:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setAlignment((QLabel *)_o,(Alignment)*(Int *)pQVar8);
          return;
        }
        break;
      case 5:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setWordWrap((QLabel *)_o,(bool)*pQVar8);
          return;
        }
        break;
      case 6:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setMargin((QLabel *)_o,*(Int *)pQVar8);
          return;
        }
        break;
      case 7:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setIndent((QLabel *)_o,*(Int *)pQVar8);
          return;
        }
        break;
      case 8:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setOpenExternalLinks((QLabel *)_o,(bool)*pQVar8);
          return;
        }
        break;
      case 9:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          setTextInteractionFlags((QLabel *)_o,(TextInteractionFlags)*(Int *)pQVar8);
          return;
        }
      }
      goto LAB_003e6391;
    }
  default:
    goto switchD_003e5f46_caseD_3;
  case IndexOfMethod:
    bVar4 = QtMocHelpers::indexOfMethod<void(QLabel::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)linkActivated,0,0);
    if (!bVar4) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QLabel::*)(QString_const&)>
                  ((QtMocHelpers *)_a,(void **)linkHovered,0,1);
        return;
      }
      goto LAB_003e6391;
    }
    goto switchD_003e5f46_caseD_3;
  }
  pQVar8 = (QPixmap *)*_a;
  switch(_id) {
  case 0:
    text((QString *)local_38,(QLabel *)_o);
    goto LAB_003e62a3;
  case 1:
    uVar7 = *(undefined4 *)(*(long *)(_o + 8) + 0x324);
    goto LAB_003e635d;
  case 2:
    pixmap((QLabel *)local_38);
    QPixmap::operator=(pQVar8,(QPixmap *)local_38);
    QPixmap::~QPixmap((QPixmap *)local_38);
    break;
  case 3:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x340) >> 1;
    goto LAB_003e6375;
  case 4:
    *(uint *)pQVar8 = *(uint *)(*(long *)(_o + 8) + 0x338) & 0x1ff;
    break;
  case 5:
    *pQVar8 = (QPixmap)((byte)(*(uint *)(*(long *)(_o + 8) + 0x338) >> 0xc) & 1);
    break;
  case 6:
    uVar7 = *(undefined4 *)(*(long *)(_o + 8) + 0x334);
    goto LAB_003e635d;
  case 7:
    uVar7 = *(undefined4 *)(*(long *)(_o + 8) + 0x33c);
    goto LAB_003e635d;
  case 8:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x341);
LAB_003e6375:
    QVar6 = (QPixmap)(bVar5 & 1);
LAB_003e6377:
    *pQVar8 = QVar6;
    break;
  case 9:
    uVar7 = *(undefined4 *)(*(long *)(_o + 8) + 0x32c);
LAB_003e635d:
    *(undefined4 *)pQVar8 = uVar7;
    break;
  case 10:
    QVar6 = (QPixmap)hasSelectedText((QLabel *)_o);
    goto LAB_003e6377;
  case 0xb:
    selectedText((QString *)local_38,(QLabel *)_o);
LAB_003e62a3:
    pDVar2 = *(Data **)pQVar8;
    pcVar3 = *(char16_t **)(pQVar8 + 8);
    *(undefined8 *)pQVar8 = local_38._0_8_;
    *(undefined8 *)(pQVar8 + 8) = local_38._8_8_;
    qVar1 = *(qsizetype *)(pQVar8 + 0x10);
    *(qsizetype *)(pQVar8 + 0x10) = local_28;
    local_38._0_8_ = pDVar2;
    local_38._8_8_ = pcVar3;
    local_28 = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
  }
switchD_003e5f46_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003e6391:
  __stack_chk_fail();
}

Assistant:

void QLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLabel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->setPixmap((*reinterpret_cast< std::add_pointer_t<QPixmap>>(_a[1]))); break;
        case 4: _t->setPicture((*reinterpret_cast< std::add_pointer_t<QPicture>>(_a[1]))); break;
        case 5: _t->setMovie((*reinterpret_cast< std::add_pointer_t<QMovie*>>(_a[1]))); break;
        case 6: _t->setNum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setNum((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 8: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkActivated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkHovered, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->pixmap(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasScaledContents(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->margin(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->indent(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 9: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 2: _t->setPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setScaledContents(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMargin(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setIndent(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        default: break;
        }
    }
}